

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest(CodeGeneratorRequest *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorRequest_00426e00;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->proto_file_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (CodeGeneratorRequest *)&_CodeGeneratorRequest_default_instance_) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  (this->parameter_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->compiler_version_ = (Version *)0x0;
  return;
}

Assistant:

CodeGeneratorRequest::CodeGeneratorRequest()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.compiler.CodeGeneratorRequest)
}